

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

int Ifn_ManStrCheck(char *pStr,int *pnInps,int *pnObjs)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  char *format;
  byte *pStr_00;
  undefined4 auStack_23c [91];
  undefined8 uStack_d0;
  int *local_c8;
  int *local_c0;
  int Marks [32];
  
  Marks[0x1c] = 0;
  Marks[0x1d] = 0;
  Marks[0x1e] = 0;
  Marks[0x1f] = 0;
  Marks[0x18] = 0;
  Marks[0x19] = 0;
  Marks[0x1a] = 0;
  Marks[0x1b] = 0;
  Marks[0x14] = 0;
  Marks[0x15] = 0;
  Marks[0x16] = 0;
  Marks[0x17] = 0;
  Marks[0x10] = 0;
  Marks[0x11] = 0;
  Marks[0x12] = 0;
  Marks[0x13] = 0;
  Marks[0xc] = 0;
  Marks[0xd] = 0;
  Marks[0xe] = 0;
  Marks[0xf] = 0;
  Marks[8] = 0;
  Marks[9] = 0;
  Marks[10] = 0;
  Marks[0xb] = 0;
  Marks[4] = 0;
  Marks[5] = 0;
  Marks[6] = 0;
  Marks[7] = 0;
  Marks[0] = 0;
  Marks[1] = 0;
  Marks[2] = 0;
  Marks[3] = 0;
  uVar4 = 0xffffffff;
  iVar6 = 0;
  pStr_00 = (byte *)pStr;
  local_c8 = pnInps;
  local_c0 = pnObjs;
  do {
    bVar1 = *pStr_00;
    if ((ulong)bVar1 == 0) {
      lVar5 = 0;
      while( true ) {
        if ((int)uVar4 < lVar5) {
          *local_c8 = uVar4 + 1;
          *local_c0 = uVar4 + 1 + iVar6;
          return 1;
        }
        if (Marks[lVar5] == 0) break;
        lVar5 = lVar5 + 1;
      }
      uVar4 = (int)lVar5 + 0x61;
      format = "String \"%s\" has no symbol \'%c\'.\n";
LAB_00395f40:
      uStack_d0 = 0x395f47;
      Ifn_ErrorMessage(format,pStr,(ulong)uVar4);
      return 0;
    }
    uStack_d0 = 0x395eb2;
    iVar3 = Inf_ManOpenSymb((char *)pStr_00);
    iVar6 = (iVar6 + 1) - (uint)(iVar3 == 0);
    if ((((0x35 < bVar1 - 0x28) || ((0x28000000580003U >> ((ulong)(bVar1 - 0x28) & 0x3f) & 1) == 0))
        && (bVar1 != 0x7b)) && ((bVar1 != 0x7d && (0x19 < (byte)(bVar1 + 0xbf))))) {
      bVar2 = bVar1 + 0x9f;
      if (0x19 < bVar2) {
        uVar4 = (uint)(char)bVar1;
        format = "String \"%s\" contains unrecognized symbol \'%c\'.\n";
        goto LAB_00395f40;
      }
      if ((int)uVar4 <= (int)(uint)bVar2) {
        uVar4 = (uint)bVar2;
      }
      auStack_23c[bVar1] = 1;
    }
    pStr_00 = pStr_00 + 1;
  } while( true );
}

Assistant:

int Ifn_ManStrCheck( char * pStr, int * pnInps, int * pnObjs )
{
    int i, nNodes = 0, Marks[32] = {0}, MaxVar = -1;
    for ( i = 0; pStr[i]; i++ )
    {
        if ( Inf_ManOpenSymb(pStr+i) )
            nNodes++;
        if ( pStr[i] == ';' || 
             pStr[i] == '(' || pStr[i] == ')' || 
             pStr[i] == '[' || pStr[i] == ']' || 
             pStr[i] == '<' || pStr[i] == '>' || 
             pStr[i] == '{' || pStr[i] == '}' )
            continue;
        if ( pStr[i] >= 'A' && pStr[i] <= 'Z' )
            continue;
        if ( pStr[i] >= 'a' && pStr[i] <= 'z' )
        {
            MaxVar = Abc_MaxInt( MaxVar, (int)(pStr[i] - 'a') );
            Marks[pStr[i] - 'a'] = 1;
            continue;
        }
        return Ifn_ErrorMessage( "String \"%s\" contains unrecognized symbol \'%c\'.\n", pStr, pStr[i] );
    }
    for ( i = 0; i <= MaxVar; i++ )
        if ( Marks[i] == 0 )
            return Ifn_ErrorMessage( "String \"%s\" has no symbol \'%c\'.\n", pStr, 'a' + i );
    *pnInps = MaxVar + 1;
    *pnObjs = MaxVar + 1 + nNodes;
    return 1;
}